

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O2

If_Obj_t *
Lpk_MapTree_rec(Lpk_Man_t *p,Kit_DsdNtk_t *pNtk,If_Obj_t **ppLeaves,int iLit,If_Obj_t *pResult)

{
  ushort uVar1;
  Kit_DsdObj_t *pKVar2;
  If_Obj_t *pIVar3;
  Kit_DsdObj_t KVar4;
  If_Obj_t *pIVar5;
  If_Obj_t *pIVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  If_Obj_t *local_b8 [17];
  
  if (iLit < 0) {
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x74,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  uVar7 = (uint)iLit >> 1;
  uVar1 = pNtk->nVars;
  if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar7) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if ((uVar7 < uVar1) ||
     (pKVar2 = pNtk->pNodes[(ulong)uVar7 - (ulong)uVar1], pKVar2 == (Kit_DsdObj_t *)0x0)) {
    return (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)ppLeaves[uVar7]);
  }
  KVar4 = *pKVar2;
  switch((uint)KVar4 >> 6 & 7) {
  case 1:
    pIVar6 = (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)p->pIfMan->pConst1);
    break;
  case 2:
    pIVar6 = (If_Obj_t *)
             ((ulong)((iLit ^ (uint)*(ushort *)(pKVar2 + 1)) & 1) ^
             *(ulong *)((long)ppLeaves + (ulong)(*(ushort *)(pKVar2 + 1) & 0xfffffffe) * 4));
    break;
  case 3:
    if (((uint)KVar4 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x88,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    pIVar6 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar2 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar2[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (pIVar6 == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    pIVar6 = If_ManCreateAnd(p->pIfMan,pIVar6,pResult);
LAB_00416a85:
    uVar7 = iLit & 1;
    goto LAB_00416a88;
  case 4:
    if (((uint)KVar4 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x93,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    pIVar6 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar2 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar2[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (pIVar6 == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    uVar7 = (iLit ^ (uint)pResult ^ (uint)pIVar6) & 1;
    pIVar6 = If_ManCreateXor(p->pIfMan,(If_Obj_t *)((ulong)pIVar6 & 0xfffffffffffffffe),
                             (If_Obj_t *)((ulong)pResult & 0xfffffffffffffffe));
LAB_00416a88:
    pIVar6 = (If_Obj_t *)((ulong)uVar7 ^ (ulong)pIVar6);
    break;
  case 5:
    p->nBlocks[(uint)KVar4 >> 0x1a] = p->nBlocks[(uint)KVar4 >> 0x1a] + 1;
    pIVar6 = (If_Obj_t *)0x0;
    uVar9 = 0;
    do {
      KVar4 = *pKVar2;
      uVar7 = (uint)KVar4 >> 0x1a;
      if (uVar7 <= uVar9) {
        if ((0 < p->pPars->nVarsShared) && (p->pPars->nLutSize < (int)uVar7)) {
          puVar8 = (uint *)0x0;
          if (((uint)KVar4 & 0x1c0) == 0x140) {
            puVar8 = (uint *)((long)&pKVar2[1].field_0x0 + (ulong)((uint)KVar4 >> 8 & 0x3fc));
          }
          pIVar6 = Lpk_MapSuppRedDec_rec(p,puVar8,uVar7,local_b8);
          if (pIVar6 != (If_Obj_t *)0x0) {
            return (If_Obj_t *)((ulong)pIVar6 ^ (ulong)(iLit & 1));
          }
          KVar4 = *pKVar2;
          uVar7 = (uint)KVar4 >> 0x1a;
        }
        puVar8 = (uint *)0x0;
        if (((uint)KVar4 & 0x1c0) == 0x140) {
          puVar8 = (uint *)((long)&pKVar2[1].field_0x0 + (ulong)((uint)KVar4 >> 8 & 0x3fc));
        }
        pIVar6 = Lpk_MapPrime(p,puVar8,uVar7,local_b8);
        goto LAB_00416a85;
      }
      uVar7 = (uint)*(ushort *)((long)&pKVar2[1].field_0x0 + uVar9 * 2);
      if (uVar9 == 0) {
        pIVar5 = pResult;
        pIVar3 = pResult;
        if (pResult == (If_Obj_t *)0x0) {
          pIVar5 = Lpk_MapTree_rec(p,pNtk,ppLeaves,uVar7,(If_Obj_t *)0x0);
          pIVar3 = pIVar5;
        }
      }
      else {
        pIVar5 = Lpk_MapTree_rec(p,pNtk,ppLeaves,uVar7,(If_Obj_t *)0x0);
        local_b8[uVar9] = pIVar5;
        pIVar3 = local_b8[0];
      }
      local_b8[0] = pIVar3;
      uVar9 = uVar9 + 1;
    } while (pIVar5 != (If_Obj_t *)0x0);
    break;
  default:
    __assert_fail("pObj->Type == KIT_DSD_PRIME",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x9c,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  return pIVar6;
}

Assistant:

If_Obj_t * Lpk_MapTree_rec( Lpk_Man_t * p, Kit_DsdNtk_t * pNtk, If_Obj_t ** ppLeaves, int iLit, If_Obj_t * pResult )
{
    Kit_DsdObj_t * pObj;
    If_Obj_t * pObjNew = NULL, * pObjNew2 = NULL, * pFansNew[16];
    unsigned i, iLitFanin;

    assert( iLit >= 0 );

    // consider the case of a gate
    pObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(iLit)];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        return If_NotCond( If_ManConst1(p->pIfMan), Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_VAR )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(pObj->pFans[0])];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(pObj->pFans[0]) );
    }
    if ( pObj->Type == KIT_DSD_AND )
    {
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        pObjNew = If_ManCreateAnd( p->pIfMan, pFansNew[0], pFansNew[1] ); 
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        fCompl ^= If_IsComplement(pFansNew[0]) ^ If_IsComplement(pFansNew[1]);
        pObjNew = If_ManCreateXor( p->pIfMan, If_Regular(pFansNew[0]), If_Regular(pFansNew[1]) );
        return If_NotCond( pObjNew, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    p->nBlocks[pObj->nFans]++;

    // solve for the inputs
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        if ( i == 0 )
            pFansNew[i] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        else
            pFansNew[i] = Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        if ( pFansNew[i] == NULL )
            return NULL;
    }
/* 
    if ( !p->fCofactoring && p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew = Lpk_MapTreeMulti( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
*/
/*
    if ( (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapTreeMux_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
//        if ( pObjNew2 )
//            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }
*/

    // find best cofactoring variable
    if ( p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapSuppRedDec_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        if ( pObjNew2 )
            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }

    pObjNew = Lpk_MapPrime( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );

    // add choice
    if ( pObjNew && pObjNew2 )
    {
        If_ObjSetChoice( If_Regular(pObjNew), If_Regular(pObjNew2) );
        If_ManCreateChoice( p->pIfMan, If_Regular(pObjNew) );
    }
    return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
}